

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::UTF8CharactersTest::prepareNextTestCase
          (UTF8CharactersTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  testCase tVar1;
  GLchar *pGVar2;
  undefined1 local_190 [384];
  
  if (test_case_index == 0xffffffff) {
    tVar1.m_case = DEBUG_CASE;
    tVar1.m_character = EMPTY;
  }
  else {
    if (0x17 < test_case_index) {
      return false;
    }
    tVar1 = prepareNextTestCase::test_cases[test_case_index];
  }
  this->m_test_case = tVar1;
  local_190._0_8_ = *(undefined8 *)(**(long **)&this->field_0x70 + 0x10);
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Test case: utf8 character: ");
  pGVar2 = Utils::getUtf8Character((this->m_test_case).m_character);
  std::operator<<((ostream *)this_00,pGVar2);
  std::operator<<((ostream *)this_00," is placed ");
  pGVar2 = casesToStr(this);
  std::operator<<((ostream *)this_00,pGVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  return true;
}

Assistant:

bool UTF8CharactersTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	static const testCase test_cases[] = {
		{ IN_COMMENT, Utils::TWO_BYTES },
		{ IN_COMMENT, Utils::THREE_BYTES },
		{ IN_COMMENT, Utils::FOUR_BYTES },
		{ IN_COMMENT, Utils::FIVE_BYTES },
		{ IN_COMMENT, Utils::SIX_BYTES },
		{ IN_COMMENT, Utils::REDUNDANT_ASCII },
		{ IN_PREPROCESSOR, Utils::TWO_BYTES },
		{ IN_PREPROCESSOR, Utils::THREE_BYTES },
		{ IN_PREPROCESSOR, Utils::FOUR_BYTES },
		{ IN_PREPROCESSOR, Utils::FIVE_BYTES },
		{ IN_PREPROCESSOR, Utils::SIX_BYTES },
		{ IN_PREPROCESSOR, Utils::REDUNDANT_ASCII },
		{ AS_LAST_CHARACTER_NULL_TERMINATED, Utils::TWO_BYTES },
		{ AS_LAST_CHARACTER_NULL_TERMINATED, Utils::THREE_BYTES },
		{ AS_LAST_CHARACTER_NULL_TERMINATED, Utils::FOUR_BYTES },
		{ AS_LAST_CHARACTER_NULL_TERMINATED, Utils::FIVE_BYTES },
		{ AS_LAST_CHARACTER_NULL_TERMINATED, Utils::SIX_BYTES },
		{ AS_LAST_CHARACTER_NULL_TERMINATED, Utils::REDUNDANT_ASCII },
		{ AS_LAST_CHARACTER_NON_NULL_TERMINATED, Utils::TWO_BYTES },
		{ AS_LAST_CHARACTER_NON_NULL_TERMINATED, Utils::THREE_BYTES },
		{ AS_LAST_CHARACTER_NON_NULL_TERMINATED, Utils::FOUR_BYTES },
		{ AS_LAST_CHARACTER_NON_NULL_TERMINATED, Utils::FIVE_BYTES },
		{ AS_LAST_CHARACTER_NON_NULL_TERMINATED, Utils::SIX_BYTES },
		{ AS_LAST_CHARACTER_NON_NULL_TERMINATED, Utils::REDUNDANT_ASCII },
	};

	static const GLuint max_test_cases = sizeof(test_cases) / sizeof(testCase);

	if ((GLuint)-1 == test_case_index)
	{
		m_test_case.m_case		= DEBUG_CASE;
		m_test_case.m_character = Utils::EMPTY;
	}
	else if (max_test_cases <= test_case_index)
	{
		return false;
	}
	else
	{
		m_test_case = test_cases[test_case_index];
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: utf8 character: "
										<< Utils::getUtf8Character(m_test_case.m_character) << " is placed "
										<< casesToStr() << tcu::TestLog::EndMessage;

	return true;
}